

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

Info * __thiscall V2Transport::GetInfo(Info *__return_storage_ptr__,V2Transport *this)

{
  RecvState RVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock56;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &(this->m_recv_mutex).super_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  RVar1 = this->m_recv_state;
  if (RVar1 == V1) {
    __return_storage_ptr__->transport_type = V1;
    (__return_storage_ptr__->session_id).super__Optional_base<uint256,_true,_true>._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = false;
  }
  else {
    (__return_storage_ptr__->session_id).super__Optional_base<uint256,_true,_true>._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = false;
    if (RVar1 < APP) {
      __return_storage_ptr__->transport_type = DETECTING;
    }
    else {
      __return_storage_ptr__->transport_type = V2;
      uVar2 = *(undefined8 *)((this->m_cipher).m_session_id._M_elems + 8);
      uVar3 = *(undefined8 *)((this->m_cipher).m_session_id._M_elems + 0x10);
      uVar4 = *(undefined8 *)((this->m_cipher).m_session_id._M_elems + 0x18);
      *(undefined8 *)
       &(__return_storage_ptr__->session_id).super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_payload =
           *(undefined8 *)(this->m_cipher).m_session_id._M_elems;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->session_id).super__Optional_base<uint256,_true,_true>.
               _M_payload.super__Optional_payload_base<uint256>._M_payload + 8) = uVar2;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->session_id).super__Optional_base<uint256,_true,_true>.
               _M_payload.super__Optional_payload_base<uint256>._M_payload + 0x10) = uVar3;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->session_id).super__Optional_base<uint256,_true,_true>.
               _M_payload.super__Optional_payload_base<uint256>._M_payload + 0x18) = uVar4;
      if ((__return_storage_ptr__->session_id).super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_engaged == false) {
        (__return_storage_ptr__->session_id).super__Optional_base<uint256,_true,_true>._M_payload.
        super__Optional_payload_base<uint256>._M_engaged = true;
      }
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Transport::Info V2Transport::GetInfo() const noexcept
{
    AssertLockNotHeld(m_recv_mutex);
    LOCK(m_recv_mutex);
    if (m_recv_state == RecvState::V1) return m_v1_fallback.GetInfo();

    Transport::Info info;

    // Do not report v2 and session ID until the version packet has been received
    // and verified (confirming that the other side very likely has the same keys as us).
    if (m_recv_state != RecvState::KEY_MAYBE_V1 && m_recv_state != RecvState::KEY &&
        m_recv_state != RecvState::GARB_GARBTERM && m_recv_state != RecvState::VERSION) {
        info.transport_type = TransportProtocolType::V2;
        info.session_id = uint256(MakeUCharSpan(m_cipher.GetSessionID()));
    } else {
        info.transport_type = TransportProtocolType::DETECTING;
    }

    return info;
}